

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

ON_BrepFace * __thiscall
ON_Brep::NewFace(ON_Brep *this,ON_Surface *pSurface,int *vid,int *eid,bool *bRev3d)

{
  int face_index;
  uint uVar1;
  ON_BrepFace *pOVar2;
  ON_BrepFace *pOVar3;
  ON_BrepLoop *pOVar4;
  int si;
  bool bVar5;
  
  ON_BoundingBox::Destroy(&this->m_bbox);
  this->m_is_solid = 0;
  pOVar3 = (ON_BrepFace *)0x0;
  if (pSurface != (ON_Surface *)0x0) {
    uVar1 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
    pOVar2 = (ON_BrepFace *)(ulong)uVar1;
    if ((int)uVar1 < 1) {
      pOVar2 = pOVar3;
    }
    for (; pOVar2 != pOVar3;
        pOVar3 = (ON_BrepFace *)
                 ((long)&(pOVar3->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.
                         super_ON_Object._vptr_ON_Object + 1)) {
      if ((this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[(long)pOVar3] == pSurface) {
        bVar5 = false;
        goto LAB_00435f71;
      }
    }
    uVar1 = AddSurface(this,pSurface);
    pOVar3 = (ON_BrepFace *)(ulong)uVar1;
    bVar5 = -1 < (int)uVar1;
LAB_00435f71:
    si = (int)pOVar3;
    pOVar3 = NewFace(this,si);
    face_index = pOVar3->m_face_index;
    pOVar4 = NewOuterLoop(this,face_index,vid,eid,bRev3d);
    if (pOVar4 == (ON_BrepLoop *)0x0) {
      if ((((bVar5) &&
           ((this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[si] = (ON_Surface *)0x0,
           (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count == si + 1)) && (-1 < si)) &&
         (si <= (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_capacity)) {
        (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count = si;
      }
      DeleteFace(this,(this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>
                      .m_a + face_index,false);
      pOVar3 = (ON_BrepFace *)0x0;
      if ((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count ==
          face_index + 1) {
        pOVar3 = (ON_BrepFace *)0x0;
        if ((-1 < face_index) &&
           (pOVar3 = (ON_BrepFace *)0x0,
           face_index <=
           (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_capacity
           )) {
          (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count =
               face_index;
          pOVar3 = (ON_BrepFace *)0x0;
        }
      }
    }
    else {
      pOVar3 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a +
               face_index;
    }
  }
  return pOVar3;
}

Assistant:

ON_BrepFace* ON_Brep::NewFace(
       ON_Surface* pSurface,
       int vid[4],
       int eid[4],
       bool bRev3d[4]
       )
{
  m_bbox.Destroy();
  m_is_solid = 0;
  bool bAddedSurface = false;
  ON_BrepFace* pFace = nullptr;
  if ( !pSurface )
    return nullptr;
  int si;
  for ( si = 0; si < m_S.Count(); si++ )
  {
    if ( pSurface == m_S[si] )
      break;
  }
  if ( si >= m_S.Count() )
  {
    si = AddSurface(pSurface);
    bAddedSurface = (si >= 0);
  }
  int face_index = NewFace(si).m_face_index;
  if ( NewOuterLoop( face_index, vid, eid, bRev3d ) )
  {
    pFace = &m_F[face_index];
  }
  else 
  {
    // failed
    if ( bAddedSurface )
    {
      m_S[si] = 0;
      if ( m_S.Count() == si+1 )
        m_S.SetCount(si);
    }
    DeleteFace( m_F[face_index], false );
    if ( m_F.Count() == face_index+1 )
    {
      m_F.SetCount(face_index);
    }
  }
  return pFace;
}